

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_cut.c
# Opt level: O0

ssize_t mpt_buffer_cut(mpt_buffer *buf,size_t off,size_t len)

{
  mpt_type_traits *pmVar1;
  ulong uVar2;
  _func_void_void_ptr *p_Var3;
  void *__dest;
  size_t __n;
  ulong local_58;
  size_t i;
  size_t size;
  _func_void_void_ptr *fini;
  size_t keep;
  uint8_t *pos;
  mpt_type_traits *traits;
  size_t len_local;
  size_t off_local;
  mpt_buffer *buf_local;
  
  if (buf->_used < len) {
    buf_local = (mpt_buffer *)0xffffffffffffffff;
  }
  else {
    fini = (_func_void_void_ptr *)off;
    if ((len == 0) || (fini = (_func_void_void_ptr *)(buf->_used - len), off <= fini)) {
      __dest = (void *)((long)&buf[1]._vptr + off);
      pmVar1 = buf->_content_traits;
      if (pmVar1 != (mpt_type_traits *)0x0) {
        uVar2 = pmVar1->size;
        if (((uVar2 == 0) || (off % uVar2 != 0)) || (len % uVar2 != 0)) {
          return -1;
        }
        p_Var3 = pmVar1->fini;
        if (p_Var3 != (_func_void_void_ptr *)0x0) {
          for (local_58 = 0; local_58 < len; local_58 = uVar2 + local_58) {
            (*p_Var3)((void *)((long)__dest + local_58));
          }
        }
      }
      __n = (long)fini - off;
      len_local = off;
      if (__n != 0) {
        memmove(__dest,(void *)((long)__dest + len),__n);
        len_local = __n + off;
      }
      buf->_used = len_local;
      buf_local = (mpt_buffer *)len_local;
    }
    else {
      buf_local = (mpt_buffer *)0xfffffffffffffff0;
    }
  }
  return (ssize_t)buf_local;
}

Assistant:

ssize_t mpt_buffer_cut(MPT_STRUCT(buffer) *buf, size_t off, size_t len)
{
	const MPT_STRUCT(type_traits) *traits;
	uint8_t *pos;
	size_t keep;
	
	if (len > buf->_used) {
		return MPT_ERROR(BadArgument);
	}
	/* only keep data till offset */
	if (!len) {
		keep = off;
	}
	/* dat must be in range */
	else if ((keep = buf->_used - len) < off) {
		return MPT_ERROR(MissingData);
	}
	/* data start */
	pos = ((uint8_t *) (buf + 1)) + off;
	
	/* invalidate data to cut */
	if ((traits = buf->_content_traits)) {
		void (*fini)(void *);
		size_t size;
		if (!(size = traits->size)
		    || off % size
		    || len % size) {
			return MPT_ERROR(BadArgument);
		}
		if ((fini = traits->fini)) {
			size_t i;
			for (i = 0; i < len; i += size) {
				fini(pos + i);
			}
		}
	}
	/* move forward data after cut */
	keep -= off;
	if (keep) {
		memmove(pos, pos + len, keep);
		off += keep;
	}
	buf->_used = off;
	return off;
}